

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  u16 *puVar1;
  short sVar2;
  int iVar3;
  Table *pTVar4;
  Index *pIVar5;
  byte bVar6;
  byte bVar7;
  uchar uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  byte *pbVar16;
  uchar uVar17;
  
  pTVar4 = pParse->pNewTable;
  if ((pTVar4 == (Table *)0x0) || (pParse->declareVtab != '\0')) goto LAB_0014c2f7;
  if ((pTVar4->tabFlags & 4) != 0) {
    sqlite3ErrorMsg(pParse,"table \"%s\" has more than one primary key",pTVar4->zName);
    goto LAB_0014c2f7;
  }
  bVar6 = pTVar4->tabFlags | 4;
  pTVar4->tabFlags = bVar6;
  if (pList == (ExprList *)0x0) {
    uVar10 = (ulong)((int)pTVar4->nCol - 1);
    puVar1 = &pTVar4->aCol[(long)(int)pTVar4->nCol + -1].colFlags;
    *puVar1 = *puVar1 | 1;
LAB_0014c201:
    if (((-1 < (int)uVar10) && ((int)uVar10 < (int)pTVar4->nCol)) &&
       (pbVar16 = (byte *)pTVar4->aCol[uVar10 & 0xffffffff].zType, pbVar16 != (byte *)0x0)) {
      bVar12 = *pbVar16;
      if (bVar12 == 0) {
        pcVar11 = "INTEGER";
        uVar14 = 0;
      }
      else {
        pcVar11 = "INTEGER";
        do {
          pbVar16 = pbVar16 + 1;
          uVar14 = (ulong)bVar12;
          if (""[bVar12] != ""[(byte)*pcVar11]) break;
          pcVar11 = (char *)((byte *)pcVar11 + 1);
          bVar12 = *pbVar16;
          uVar14 = 0;
        } while (bVar12 != 0);
      }
      if (""[uVar14] == ""[(byte)*pcVar11] && sortOrder == 0) {
        pTVar4->iPKey = (i16)uVar10;
        pTVar4->keyConf = (u8)onError;
        pTVar4->tabFlags = bVar6 | (char)autoInc << 3;
        goto LAB_0014c2f7;
      }
    }
  }
  else {
    iVar3 = pList->nExpr;
    if (0 < (long)iVar3) {
      sVar2 = pTVar4->nCol;
      uVar14 = (ulong)(uint)(int)sVar2;
      lVar15 = 0;
      do {
        uVar10 = 0;
        if (0 < sVar2) {
          pbVar16 = (byte *)pList->a[lVar15].zName;
          bVar12 = *pbVar16;
          uVar9 = 0;
          do {
            pcVar11 = pTVar4->aCol[uVar9].zName;
            if (bVar12 == 0) {
              if (*pcVar11 == '\0') goto LAB_0014c191;
            }
            else {
              lVar13 = 0;
              bVar7 = bVar12;
              do {
                uVar17 = ""[bVar7];
                uVar8 = ""[(byte)pcVar11[lVar13]];
                if (uVar17 != uVar8) goto LAB_0014c178;
                bVar7 = pbVar16[lVar13 + 1];
                lVar13 = lVar13 + 1;
              } while (bVar7 != 0);
              uVar8 = ""[(byte)pcVar11[lVar13]];
              uVar17 = '\0';
LAB_0014c178:
              if (uVar17 == uVar8) {
LAB_0014c191:
                puVar1 = &pTVar4->aCol[uVar9 & 0xffffffff].colFlags;
                *(byte *)puVar1 = (byte)*puVar1 | 1;
                uVar10 = uVar9;
                break;
              }
            }
            uVar9 = uVar9 + 1;
            uVar10 = uVar14;
          } while (uVar9 != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar3);
      if (iVar3 == 1) goto LAB_0014c201;
    }
  }
  if (autoInc == 0) {
    pIVar5 = sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,onError,
                                (Token *)0x0,(Token *)0x0,sortOrder,0);
    pList = (ExprList *)0x0;
    if (pIVar5 != (Index *)0x0) {
      pIVar5->field_0x4f = pIVar5->field_0x4f & 0xfc | 2;
      pList = (ExprList *)0x0;
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
  }
LAB_0014c2f7:
  sqlite3ExprListDelete(pParse->db,pList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  char *zType = 0;
  int iCol = -1, i;
  if( pTab==0 || IN_DECLARE_VTAB ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse, 
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pTab->aCol[iCol].colFlags |= COLFLAG_PRIMKEY;
  }else{
    for(i=0; i<pList->nExpr; i++){
      for(iCol=0; iCol<pTab->nCol; iCol++){
        if( sqlite3StrICmp(pList->a[i].zName, pTab->aCol[iCol].zName)==0 ){
          break;
        }
      }
      if( iCol<pTab->nCol ){
        pTab->aCol[iCol].colFlags |= COLFLAG_PRIMKEY;
      }
    }
    if( pList->nExpr>1 ) iCol = -1;
  }
  if( iCol>=0 && iCol<pTab->nCol ){
    zType = pTab->aCol[iCol].zType;
  }
  if( zType && sqlite3StrICmp(zType, "INTEGER")==0
        && sortOrder==SQLITE_SO_ASC ){
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    Index *p;
    p = sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0, 0, sortOrder, 0);
    if( p ){
      p->autoIndex = 2;
    }
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}